

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInteger64StateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Integer64StateQueryTests::init
          (Integer64StateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  TestContext *pTVar3;
  int iVar4;
  GetBooleanVerifier *pGVar5;
  undefined4 extraout_var;
  GetIntegerVerifier *pGVar6;
  undefined4 extraout_var_00;
  GetFloatVerifier *pGVar7;
  undefined4 extraout_var_01;
  ApiCase *pAVar8;
  long *plVar9;
  long lVar10;
  long *extraout_RAX;
  long *plVar11;
  int _verifierNdx;
  long lVar12;
  StateVerifier *verifiers [3];
  long *local_b8;
  long local_a8;
  long lStack_a0;
  allocator<char> local_91;
  long *local_90 [2];
  long local_80 [2];
  Integer64StateQueryTests *local_70;
  GetBooleanVerifier *local_68;
  GetIntegerVerifier *local_60;
  GetFloatVerifier *local_58;
  long local_48;
  long local_40;
  GetBooleanVerifier *local_38;
  
  pGVar5 = (GetBooleanVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar5->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar5->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar5->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar5->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_02188bb8;
  this->m_verifierBoolean = pGVar5;
  pGVar6 = (GetIntegerVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar6->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar6->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar6->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar6->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_02188be0;
  this->m_verifierInteger = pGVar6;
  pGVar7 = (GetFloatVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar7->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar7->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar7->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar7->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_02188c08;
  this->m_verifierFloat = pGVar7;
  local_68 = this->m_verifierBoolean;
  local_60 = this->m_verifierInteger;
  local_58 = pGVar7;
  lVar10 = 0;
  local_70 = this;
  do {
    local_48 = lVar10;
    lVar12 = 0;
    do {
      local_b8 = &local_a8;
      pGVar5 = (&local_68)[lVar12];
      pAVar8 = (ApiCase *)operator_new(0xb0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,(&PTR_anon_var_dwarf_2ad9ee5_02188c60)[lVar10 * 4],&local_91);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_90);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_a8 = *plVar11;
        lStack_a0 = plVar9[3];
      }
      else {
        local_a8 = *plVar11;
        local_b8 = (long *)*plVar9;
      }
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = (&DAT_02188c70)[lVar10 * 8];
      pTVar3 = (TestContext *)(&DAT_02188c78)[lVar10 * 4];
      local_40 = lVar12;
      local_38 = pGVar5;
      ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_b8,(char *)(&DAT_02188c68)[lVar10 * 4]);
      this = local_70;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_02188d58;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)local_38;
      tcu::TestNode::addChild((TestNode *)local_70,(TestNode *)pAVar8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      lVar12 = local_40;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar10 = local_48 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    local_b8 = &local_a8;
    pGVar5 = (&local_68)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xb0);
    pCVar2 = (local_70->super_TestCaseGroup).m_context;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"max_combined_vertex_uniform_components","");
    plVar9 = (long *)std::__cxx11::string::append((char *)local_90);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_a8 = *plVar11;
      lStack_a0 = plVar9[3];
    }
    else {
      local_a8 = *plVar11;
      local_b8 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_b8,"MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_02188db0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)0x8a2b00008a31;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8b4a;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)pGVar5
    ;
    tcu::TestNode::addChild((TestNode *)local_70,(TestNode *)pAVar8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    local_b8 = &local_a8;
    pGVar5 = (&local_68)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xb0);
    pCVar2 = (local_70->super_TestCaseGroup).m_context;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"max_combined_fragment_uniform_components","");
    plVar9 = (long *)std::__cxx11::string::append((char *)local_90);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_a8 = *plVar11;
      lStack_a0 = plVar9[3];
    }
    else {
      local_a8 = *plVar11;
      local_b8 = (long *)*plVar9;
    }
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_b8,"MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_02188db0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)0x8a2d00008a33;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8b49;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)pGVar5
    ;
    tcu::TestNode::addChild((TestNode *)local_70,(TestNode *)pAVar8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    plVar9 = local_80;
    if (local_90[0] != plVar9) {
      operator_delete(local_90[0],local_80[0] + 1);
      plVar9 = extraout_RAX;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  return (int)plVar9;
}

Assistant:

void Integer64StateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier			(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger64
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLuint64		minValue;
	} implementationLimits[] =
	{
		{ "max_element_index",			"MAX_ELEMENT_INDEX",		GL_MAX_ELEMENT_INDEX,			0x00FFFFFF /*2^24-1*/	},
		{ "max_server_wait_timeout",	"MAX_SERVER_WAIT_TIMEOUT",	GL_MAX_SERVER_WAIT_TIMEOUT,		0						},
		{ "max_uniform_block_size",		"MAX_UNIFORM_BLOCK_SIZE",	GL_MAX_UNIFORM_BLOCK_SIZE,		16384					}
	};

	// \note do not check the values with integer64 verifier as that has already been checked in implementation_limits
	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationLimits); testNdx++)
		FOR_EACH_VERIFIER(verifiers, addChild(new ConstantMinimumValue64TestCase(m_context, verifier, (std::string(implementationLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationLimits[testNdx].description, implementationLimits[testNdx].targetName, implementationLimits[testNdx].minValue)));

	FOR_EACH_VERIFIER(verifiers, addChild(new MaxCombinedStageUniformComponentsCase (m_context, verifier,	(std::string("max_combined_vertex_uniform_components")		+ verifier->getTestNamePostfix()).c_str(),	"MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS,		GL_MAX_VERTEX_UNIFORM_BLOCKS,		GL_MAX_VERTEX_UNIFORM_COMPONENTS)));
	FOR_EACH_VERIFIER(verifiers, addChild(new MaxCombinedStageUniformComponentsCase (m_context, verifier,	(std::string("max_combined_fragment_uniform_components")	+ verifier->getTestNamePostfix()).c_str(),	"MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS,	GL_MAX_FRAGMENT_UNIFORM_BLOCKS,		GL_MAX_FRAGMENT_UNIFORM_COMPONENTS)));
}